

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000173640 = 0x2e2e2e2e2e2e2e;
    uRam0000000000173647 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00173630 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000173638 = 0x2e2e2e2e2e2e2e;
    DAT_0017363f = 0x2e;
    _DAT_00173620 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000173628 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00173610 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000173618 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000173608 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017364f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }